

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void AddFontStyles(TidyDocImpl *doc,Node *node,AttVal *av)

{
  char cVar1;
  TidyAttrId TVar2;
  byte bVar3;
  int iVar4;
  tmbstr ptVar5;
  char *s1;
  char *pcVar6;
  undefined1 *puVar7;
  size_t count;
  tmbchar buf [256];
  tmbchar atStack_138 [264];
  
  if (av != (AttVal *)0x0) {
    do {
      s1 = av->value;
      if ((s1 == (ctmbstr)0x0) || (av->dict == (Attribute *)0x0)) goto LAB_00150b77;
      TVar2 = av->dict->id;
      if (TVar2 == TidyAttr_COLOR) {
        count = 0x80;
        pcVar6 = "color: %s";
LAB_00150b62:
        prvTidytmbsnprintf(atStack_138,count,pcVar6,s1);
        prvTidyAddStyleProperty(doc,node,atStack_138);
      }
      else if (TVar2 == TidyAttr_SIZE) {
        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_P)) {
LAB_00150ae7:
          cVar1 = *s1;
          if (cVar1 != '\0') {
            bVar3 = cVar1 - 0x30;
            puVar7 = FontSize2Name_sizes;
            if (bVar3 < 7) {
LAB_00150b33:
              s1 = *(char **)(puVar7 + (ulong)bVar3 * 8);
              if (s1 == (ctmbstr)0x0) goto LAB_00150b77;
            }
            else {
              bVar3 = s1[1] - 0x30;
              puVar7 = FontSize2Name_plussizes;
              if (cVar1 == '-') {
                puVar7 = FontSize2Name_minussizes;
              }
              s1 = "larger";
              if (cVar1 == '-') {
                s1 = "smaller";
              }
              if (bVar3 < 7) goto LAB_00150b33;
            }
            count = 0x40;
            pcVar6 = "font-size: %s";
            goto LAB_00150b62;
          }
        }
        else {
          iVar4 = prvTidytmbstrcmp(s1,"6");
          pcVar6 = "h1";
          if (iVar4 != 0) {
            iVar4 = prvTidytmbstrcmp(s1,"5");
            pcVar6 = "h2";
            if (iVar4 != 0) {
              iVar4 = prvTidytmbstrcmp(s1,"4");
              pcVar6 = "h3";
              if (iVar4 != 0) goto LAB_00150ae7;
            }
          }
          (*doc->allocator->vtbl->free)(doc->allocator,node->element);
          ptVar5 = prvTidytmbstrdup(doc->allocator,pcVar6);
          node->element = ptVar5;
          prvTidyFindTag(doc,node);
        }
      }
      else if (TVar2 == TidyAttr_FACE) {
        count = 0x100;
        pcVar6 = "font-family: %s";
        goto LAB_00150b62;
      }
LAB_00150b77:
      av = av->next;
    } while (av != (AttVal *)0x0);
  }
  return;
}

Assistant:

static void AddFontStyles( TidyDocImpl* doc, Node *node, AttVal *av)
{
    while (av)
    {
        if (AttrHasValue(av))
        {
            if (attrIsFACE(av))
                AddFontFace( doc, node, av->value );
            else if (attrIsSIZE(av))
                AddFontSize( doc, node, av->value );
            else if (attrIsCOLOR(av))
                AddFontColor( doc, node, av->value );
        }
        av = av->next;
    }
}